

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessToken
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  Status SVar4;
  bool bVar5;
  int iVar6;
  Value *pVVar7;
  char *pcVar8;
  undefined4 extraout_var;
  char *pcVar9;
  ByteArray *aBytes;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *psVar10;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  uint16_t port;
  uint uStack_354;
  char *pcStack_350;
  size_t local_348;
  undefined8 local_340;
  type *local_338;
  parse_func local_330 [1];
  string local_328;
  writer write;
  format_string_checker<char> *pfStack_300;
  Value local_2f0;
  CommissionerAppPtr commissioner;
  writer write_2;
  string local_290;
  undefined1 local_270 [40];
  undefined1 local_248 [40];
  undefined1 local_220 [40];
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [40];
  Network curNwk;
  undefined1 local_148 [40];
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  persistent_storage::Network::Network(&curNwk);
  JobManager::GetSelectedCommissioner
            ((Error *)local_1d0,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &commissioner);
  Value::Value(&local_2f0,(Error *)local_1d0);
  pVVar7 = Value::operator=(__return_storage_ptr__,&local_2f0);
  EVar2 = (pVVar7->mError).mCode;
  Value::~Value(&local_2f0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  if (EVar2 != kNone) goto LAB_0018c5a3;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    _port = (pointer)((ulong)_port & 0xffffffff00000000);
    pcStack_350 = "too few arguments";
    local_348 = 0x11;
    local_340._0_4_ = 0;
    local_340._4_4_ = 0;
    local_330[0] = (parse_func)0x0;
    pcVar8 = "too few arguments";
    local_338 = (type *)&port;
    while (pcVar9 = pcVar8, pcVar9 != "") {
      pcVar8 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",(format_string_checker<char> *)&port);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&port;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_328,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar10 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar10,(string *)&local_328);
    Value::Value(&local_2f0,(Error *)local_58);
  }
  else {
    SVar4 = persistent_storage::Registry::GetCurrentNetwork
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&curNwk);
    if (SVar4 == kSuccess) {
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_2f0,"request",(allocator *)&port);
      bVar5 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      if (!bVar5) {
        pbVar3 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&local_2f0,"print",(allocator *)&port);
        bVar5 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        if (bVar5) {
          iVar6 = (*((commissioner.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x41])();
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&write,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(extraout_var,iVar6));
          if (write.handler_ == pfStack_300) {
            _port = (pointer)((ulong)_port & 0xffffffff00000000);
            pcStack_350 = "no valid Commissioner Token found";
            local_348 = 0x21;
            local_340._0_4_ = 0;
            local_340._4_4_ = 0;
            local_330[0] = (parse_func)0x0;
            pcVar8 = "no valid Commissioner Token found";
            local_338 = (type *)&port;
            write_2.handler_ = (format_string_checker<char> *)&port;
            while (pcVar8 != "") {
              cVar1 = *pcVar8;
              pcVar9 = pcVar8;
              while (cVar1 != '{') {
                pcVar9 = pcVar9 + 1;
                if (pcVar9 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()(&write_2,pcVar8,"");
                  goto LAB_0018cc1c;
                }
                cVar1 = *pcVar9;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write_2,pcVar8,pcVar9);
              pcVar8 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar9,"",(format_string_checker<char> *)&port);
            }
LAB_0018cc1c:
            args_04.field_1.args_ = in_R9.args_;
            args_04.desc_ = (unsigned_long_long)&port;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_328,(v10 *)"no valid Commissioner Token found",
                       (string_view)ZEXT816(0x21),args_04);
            psVar10 = (string *)(local_f8 + 8);
            local_f8._0_4_ = kNotFound;
            std::__cxx11::string::string(psVar10,(string *)&local_328);
            Value::Value(&local_2f0,(Error *)local_f8);
LAB_0018cd22:
            Value::operator=(__return_storage_ptr__,&local_2f0);
            Value::~Value(&local_2f0);
            std::__cxx11::string::~string(psVar10);
            this_00 = &local_328;
          }
          else {
            utils::Hex_abi_cxx11_(&local_290,(utils *)&write,aBytes);
            Value::Value(&local_2f0,&local_290);
            Value::operator=(__return_storage_ptr__,&local_2f0);
            Value::~Value(&local_2f0);
            this_00 = &local_290;
          }
          std::__cxx11::string::~string((string *)this_00);
        }
        else {
          pbVar3 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string((string *)&local_2f0,"set",(allocator *)&port);
          bVar5 = CaseInsensitiveEqual(pbVar3 + 1,(string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          if (!bVar5) {
            _port = string_type;
            pcStack_350 = "\'{}\' is not a valid sub-command";
            local_348 = 0x1f;
            local_340._0_4_ = 0;
            local_340._4_4_ = 1;
            local_330[0] = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar8 = "\'{}\' is not a valid sub-command";
            local_338 = (type *)&port;
            while (pcVar9 = pcVar8, pcVar9 != "") {
              pcVar8 = pcVar9 + 1;
              if (*pcVar9 == '}') {
                if ((pcVar8 == "") || (*pcVar8 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar8 = pcVar9 + 2;
              }
              else if (*pcVar9 == '{') {
                pcVar8 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar9,"",(format_string_checker<char> *)&port);
              }
            }
            pbVar3 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            _port = pbVar3[1]._M_dataplus._M_p;
            pcStack_350 = (char *)pbVar3[1]._M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x1f;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&port;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_328,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_02);
            psVar10 = (string *)(local_148 + 8);
            local_148._0_4_ = kInvalidCommand;
            std::__cxx11::string::string(psVar10,(string *)&local_328);
            Value::Value(&local_2f0,(Error *)local_148);
            goto LAB_0018c579;
          }
          write.handler_ = (format_string_checker<char> *)0x0;
          pbVar3 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x41) {
            _port = (pointer)((ulong)uStack_354 << 0x20);
            pcStack_350 = "too few arguments";
            local_348 = 0x11;
            local_340._0_4_ = 0;
            local_340._4_4_ = 0;
            local_330[0] = (parse_func)0x0;
            pcVar8 = "too few arguments";
            local_338 = (type *)&port;
            while (pcVar9 = pcVar8, pcVar9 != "") {
              pcVar8 = pcVar9 + 1;
              if (*pcVar9 == '}') {
                if ((pcVar8 == "") || (*pcVar8 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar8 = pcVar9 + 2;
              }
              else if (*pcVar9 == '{') {
                pcVar8 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                   (pcVar9,"",(format_string_checker<char> *)&port);
              }
            }
            args_05.field_1.values_ = in_R9.values_;
            args_05.desc_ = (unsigned_long_long)&port;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_328,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_05);
            psVar10 = (string *)(local_120 + 8);
            local_120._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(psVar10,(string *)&local_328);
            Value::Value(&local_2f0,(Error *)local_120);
            goto LAB_0018cd22;
          }
          ReadHexStringFile((Error *)local_248,(ByteArray *)&write,pbVar3 + 2);
          Value::Value(&local_2f0,(Error *)local_248);
          pVVar7 = Value::operator=(__return_storage_ptr__,&local_2f0);
          EVar2 = (pVVar7->mError).mCode;
          Value::~Value(&local_2f0);
          std::__cxx11::string::~string((string *)(local_248 + 8));
          if (EVar2 == kNone) {
            (*((commissioner.
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x43])
                      (local_270,
                       commissioner.
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&write);
            Value::Value(&local_2f0,(Error *)local_270);
            pVVar7 = Value::operator=(__return_storage_ptr__,&local_2f0);
            EVar2 = (pVVar7->mError).mCode;
            Value::~Value(&local_2f0);
            std::__cxx11::string::~string((string *)(local_270 + 8));
            if ((EVar2 == kNone) && (curNwk.mId.mId == 0xffffffff)) {
              JobManager::UpdateDefaultConfigCommissionerToken
                        ((this->mJobManager).
                         super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&write);
        goto LAB_0018c5a3;
      }
      pbVar3 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x61) {
        _port = (pointer)((ulong)uStack_354 << 0x20);
        pcStack_350 = "too few arguments";
        local_348 = 0x11;
        local_340._0_4_ = 0;
        local_340._4_4_ = 0;
        local_330[0] = (parse_func)0x0;
        pcVar8 = "too few arguments";
        local_338 = (type *)&port;
        while (pcVar9 = pcVar8, pcVar9 != "") {
          pcVar8 = pcVar9 + 1;
          if (*pcVar9 == '}') {
            if ((pcVar8 == "") || (*pcVar8 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar8 = pcVar9 + 2;
          }
          else if (*pcVar9 == '{') {
            pcVar8 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar9,"",(format_string_checker<char> *)&port);
          }
        }
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)&port;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_328,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
        psVar10 = (string *)(local_a8 + 8);
        local_a8._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(psVar10,(string *)&local_328);
        Value::Value(&local_2f0,(Error *)local_a8);
      }
      else {
        if ((curNwk.mId.mId == 0xffffffff) || (curNwk.mCcm != 0)) {
          utils::ParseInteger<unsigned_short>((Error *)local_1f8,&port,pbVar3 + 3);
          Value::Value(&local_2f0,(Error *)local_1f8);
          pVVar7 = Value::operator=(__return_storage_ptr__,&local_2f0);
          EVar2 = (pVVar7->mError).mCode;
          Value::~Value(&local_2f0);
          std::__cxx11::string::~string((string *)(local_1f8 + 8));
          if (EVar2 == kNone) {
            (*((commissioner.
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x42])
                      (local_220,
                       commissioner.
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(aExpr->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 2,(ulong)_port & 0xffff)
            ;
            Value::Value(&local_2f0,(Error *)local_220);
            pVVar7 = Value::operator=(__return_storage_ptr__,&local_2f0);
            EVar2 = (pVVar7->mError).mCode;
            Value::~Value(&local_2f0);
            std::__cxx11::string::~string((string *)(local_220 + 8));
            if ((EVar2 == kNone) && (curNwk.mId.mId == 0xffffffff)) {
              JobManager::UpdateDefaultConfigCommissionerToken
                        ((this->mJobManager).
                         super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
            }
          }
          goto LAB_0018c5a3;
        }
        _port = (pointer)((ulong)uStack_354 << 0x20);
        pcStack_350 = "request disallowed when non-CCM network selected";
        local_348 = 0x30;
        local_340._0_4_ = 0;
        local_340._4_4_ = 0;
        local_330[0] = (parse_func)0x0;
        pcVar8 = "request disallowed when non-CCM network selected";
        local_338 = (type *)&port;
        write.handler_ = (format_string_checker<char> *)&port;
        while (pcVar8 != "") {
          cVar1 = *pcVar8;
          pcVar9 = pcVar8;
          while (cVar1 != '{') {
            pcVar9 = pcVar9 + 1;
            if (pcVar9 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar8,"");
              goto LAB_0018cb39;
            }
            cVar1 = *pcVar9;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&write,pcVar8,pcVar9);
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar9,"",(format_string_checker<char> *)&port);
        }
LAB_0018cb39:
        args_03.field_1.values_ = in_R9.values_;
        args_03.desc_ = (unsigned_long_long)&port;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_328,(v10 *)"request disallowed when non-CCM network selected",
                   (string_view)ZEXT816(0x30),args_03);
        psVar10 = (string *)(local_d0 + 8);
        local_d0._0_4_ = kInvalidState;
        std::__cxx11::string::string(psVar10,(string *)&local_328);
        Value::Value(&local_2f0,(Error *)local_d0);
      }
    }
    else {
      _port = int_type;
      pcStack_350 = "getting current network failed with status={}";
      local_348 = 0x2d;
      local_340._0_4_ = 0;
      local_340._4_4_ = 1;
      local_330[0] = ::fmt::v10::detail::
                     parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
      pcVar8 = "getting current network failed with status={}";
      local_338 = (type *)&port;
      write.handler_ = (format_string_checker<char> *)&port;
      while (pcVar8 != "") {
        cVar1 = *pcVar8;
        pcVar9 = pcVar8;
        while (cVar1 != '{') {
          pcVar9 = pcVar9 + 1;
          if (pcVar9 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::
            writer::operator()(&write,pcVar8,"");
            goto LAB_0018c529;
          }
          cVar1 = *pcVar9;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::writer
        ::operator()(&write,pcVar8,pcVar9);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar9,"",(format_string_checker<char> *)&port);
      }
LAB_0018c529:
      _port = (pointer)(ulong)SVar4;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2d;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&port;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_328,(v10 *)"getting current network failed with status={}",fmt,args_00);
      psVar10 = (string *)(local_80 + 8);
      local_80._0_4_ = kRegistryError;
      std::__cxx11::string::string(psVar10,(string *)&local_328);
      Value::Value(&local_2f0,(Error *)local_80);
    }
  }
LAB_0018c579:
  Value::operator=(__return_storage_ptr__,&local_2f0);
  Value::~Value(&local_2f0);
  std::__cxx11::string::~string(psVar10);
  std::__cxx11::string::~string((string *)&local_328);
LAB_0018c5a3:
  persistent_storage::Network::~Network(&curNwk);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessToken(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    RegistryStatus     status;
    Network            curNwk;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit((status = mRegistry->GetCurrentNetwork(curNwk)) == RegistryStatus::kSuccess,
                 value = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED " with status={}", static_cast<int>(status)));

    if (CaseInsensitiveEqual(aExpr[1], "request"))
    {
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        // request allowed in case of CCM network or no network selected
        if (curNwk.mId.mId == persistent_storage::EMPTY_ID || curNwk.mCcm != 0)
        {
            uint16_t port;
            SuccessOrExit(value = ParseInteger(port, aExpr[3]));
            SuccessOrExit(value = commissioner->RequestToken(aExpr[2], port));
            if (curNwk.mId.mId == persistent_storage::EMPTY_ID)
            {
                // when there is no network selected, a successful
                // 'token request' must update default configuration
                mJobManager->UpdateDefaultConfigCommissionerToken();
            }
        }
        else
        {
            ExitNow(value = ERROR_INVALID_STATE("request disallowed when non-CCM network selected"));
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "print"))
    {
        auto signedToken = commissioner->GetToken();
        VerifyOrExit(!signedToken.empty(), value = ERROR_NOT_FOUND("no valid Commissioner Token found"));
        value = utils::Hex(signedToken);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        ByteArray signedToken;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ReadHexStringFile(signedToken, aExpr[2]));

        SuccessOrExit(value = commissioner->SetToken(signedToken));
        if (curNwk.mId.mId == persistent_storage::EMPTY_ID)
        {
            // when there is no network selected, a successful
            // 'token set' must update default configuration
            // as well
            mJobManager->UpdateDefaultConfigCommissionerToken();
        }
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}